

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timernu.c
# Opt level: O0

void shutdown_timers(void)

{
  char *in_RAX;
  char *unaff_retaddr;
  int in_stack_0000000c;
  void *in_stack_00000010;
  
  _al_vector_free((_AL_VECTOR *)0x17f94d);
  if (timer_thread != (_AL_THREAD *)0x0) {
    destroy_thread = true;
    al_lock_mutex((ALLEGRO_MUTEX *)0x17f96d);
    al_signal_cond((ALLEGRO_COND *)0x17f979);
    al_unlock_mutex((ALLEGRO_MUTEX *)0x17f985);
    _al_thread_join((_AL_THREAD *)0x17f991);
  }
  al_free_with_context(in_stack_00000010,in_stack_0000000c,unaff_retaddr,in_RAX);
  timer_thread = (_AL_THREAD *)0x0;
  al_destroy_mutex((ALLEGRO_MUTEX *)0x17f9c7);
  al_destroy_cond((ALLEGRO_COND *)0x17f9d3);
  return;
}

Assistant:

static void shutdown_timers(void)
{
   ASSERT(_al_vector_size(&active_timers) == 0);

   _al_vector_free(&active_timers);

   if (timer_thread != NULL) {
      destroy_thread = true;
      al_lock_mutex(timers_mutex);
      al_signal_cond(timer_cond);
      al_unlock_mutex(timers_mutex);
      _al_thread_join(timer_thread);
   }

   al_free(timer_thread);

   timer_thread = NULL;

   al_destroy_mutex(timers_mutex);

   al_destroy_cond(timer_cond);
}